

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O2

void __thiscall
itis::AVLTree<long_long>::display
          (AVLTree<long_long> *this,AVLTreeNode<long_long> *cur,int depth,int state)

{
  ostream *poVar1;
  char *__format;
  int iVar2;
  bool bVar3;
  
  do {
    iVar2 = 0;
    if (0 < depth) {
      iVar2 = depth;
    }
    if (cur->left != (AVLTreeNode<long_long> *)0x0) {
      display(this,cur->left,depth + 1,1);
    }
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      printf("     ");
    }
    __format = anon_var_dwarf_e3a9;
    if (state == 1) {
LAB_00103bbe:
      printf(__format);
    }
    else if (state == 2) {
      __format = anon_var_dwarf_e3bf;
      goto LAB_00103bbe;
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"[");
    poVar1 = std::ostream::_M_insert<long_long>((longlong)poVar1);
    poVar1 = std::operator<<(poVar1,"] - (");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,cur->count);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,cur->height);
    poVar1 = std::operator<<(poVar1,")");
    std::endl<char,std::char_traits<char>>(poVar1);
    cur = cur->right;
    depth = depth + 1;
    state = 2;
    if (cur == (AVLTreeNode<long_long> *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void AVLTree<T>::display(AVLTreeNode<T> *cur, int depth, int state) {  // state: 1 -> left, 2 -> right , 0 -> root
    if (cur->left) {
      display(cur->left, depth + 1, 1);
    }

    for (int i = 0; i < depth; i++) {
      printf("     ");
    }

    if (state == 1) {  // left
      printf("┌───");
    } else if (state == 2) {  // right
      printf("└───");
    }

    std::cout << "[" << cur->value << "] - (" << cur->count << ", " << cur->height << ")" << std::endl;

    if (cur->right) {
      display(cur->right, depth + 1, 2);
    }
  }